

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void testing::internal::CaptureStream(int fd,char *stream_name,CapturedStream **stream)

{
  ostream *poVar1;
  CapturedStream *this;
  GTestLog local_24;
  CapturedStream **local_20;
  CapturedStream **stream_local;
  char *stream_name_local;
  int fd_local;
  
  local_20 = stream;
  stream_local = (CapturedStream **)stream_name;
  stream_name_local._4_4_ = fd;
  if (*stream != (CapturedStream *)0x0) {
    GTestLog::GTestLog(&local_24,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/nploi[P]Cplusplus/lib/googletest/googletest/src/gtest-port.cc"
                       ,0x40e);
    poVar1 = GTestLog::GetStream(&local_24);
    poVar1 = std::operator<<(poVar1,"Only one ");
    poVar1 = std::operator<<(poVar1,(char *)stream_local);
    std::operator<<(poVar1," capturer can exist at a time.");
    GTestLog::~GTestLog(&local_24);
  }
  this = (CapturedStream *)operator_new(0x28);
  CapturedStream::CapturedStream(this,stream_name_local._4_4_);
  *local_20 = this;
  return;
}

Assistant:

static void CaptureStream(int fd, const char* stream_name,
                          CapturedStream** stream) {
  if (*stream != NULL) {
    GTEST_LOG_(FATAL) << "Only one " << stream_name
                      << " capturer can exist at a time.";
  }
  *stream = new CapturedStream(fd);
}